

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentPlanner.cpp
# Opt level: O3

vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> * __thiscall
multi_agent_planning::MultiAgentPlanner::solve_best_alternative_grouping
          (vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
           *__return_storage_ptr__,MultiAgentPlanner *this,
          vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
          *agents,vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                  *instances,Scenario *scenario,int theta)

{
  int *piVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  pointer pPVar7;
  MultiAgentPlanner *this_00;
  ulong uVar8;
  Plan *this_01;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  pointer pvVar13;
  pointer this_02;
  vector<int,_std::allocator<int>_> alternativeCosts;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> alternativePlans;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> group_plans;
  vector<int,_std::allocator<int>_> costs;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  groups;
  Plan plan;
  long local_150;
  vector<int,_std::allocator<int>_> local_128;
  string local_108;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> local_e8;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> local_c8;
  pointer local_b0;
  vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_> *local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_88;
  Plan local_70;
  Plan local_50;
  
  local_a8 = instances;
  solve_baseline(__return_storage_ptr__,this,agents,instances);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_a0,
             (long)(agents->
                   super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(agents->
                   super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_70);
  if ((agents->
      super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (agents->
      super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      pPVar7 = (__return_storage_ptr__->
               super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
               )._M_impl.super__Vector_impl_data._M_start;
      this_01 = &local_50;
      std::
      vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
      ::vector(&local_50.actions,
               (vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                *)((long)&(pPVar7->actions).
                          super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                          ._M_impl + lVar12));
      local_50.cost = *(float *)((long)&pPVar7->cost + lVar12);
      iVar4 = evaluate_one_plan((MultiAgentPlanner *)this_01,__return_storage_ptr__,scenario,
                                &local_50,(int)uVar11);
      local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = iVar4;
      if (local_50.actions.
          super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.actions.
                        super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x20;
    } while (uVar11 < (ulong)((long)(agents->
                                    super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(agents->
                                    super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  if (1 < theta) {
    iVar4 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"!!!!!!!!!!!! Iteration ",0x17);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," !!!!!!!!!!!!",0xd);
      cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      this_00 = (MultiAgentPlanner *)(ulong)(uint)(int)cVar3;
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      get_interacting_groups(&local_88,this_00,__return_storage_ptr__,scenario);
      local_b0 = local_88.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_88.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_88.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar2 = true;
      }
      else {
        bVar2 = true;
        pvVar13 = local_88.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_c8.
          super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.
          super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8.
          super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          piVar1 = (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar6 = (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; piVar6 != piVar1; piVar6 = piVar6 + 1) {
            std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
            push_back(&local_c8,
                      (__return_storage_ptr__->
                      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                      )._M_impl.super__Vector_impl_data._M_start + *piVar6);
          }
          local_e8.
          super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.
          super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.
          super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          piVar6 = (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar1 = (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (piVar6 == piVar1) {
LAB_0013b5fe:
            local_150 = 0;
          }
          else {
            do {
              iVar9 = *piVar6;
              PlanningAgent::computeInterDependentPlan
                        (&local_70,
                         (agents->
                         super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                         )._M_impl.super__Vector_impl_data._M_start + iVar9,
                         (local_a8->
                         super__Vector_base<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                         )._M_impl.super__Vector_impl_data._M_start + iVar9,scenario,&local_c8,1.0);
              std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
              push_back(&local_e8,&local_70);
              PlanningAgent::planToString_abi_cxx11_
                        (&local_108,
                         (agents->
                         super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                         )._M_impl.super__Vector_impl_data._M_start + iVar9,&local_70);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,
                                          (int)local_108._M_dataplus._M_p),
                         local_108._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_108._M_dataplus._M_p._4_4_,(int)local_108._M_dataplus._M_p) !=
                  &local_108.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_108._M_dataplus._M_p._4_4_,
                                         (int)local_108._M_dataplus._M_p));
              }
              local_108._M_dataplus._M_p._0_4_ = (int)local_70.cost;
              if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_128,
                           (iterator)
                           local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_108);
              }
              else {
                *local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = (int)local_108._M_dataplus._M_p;
                local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (local_70.actions.
                  super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_70.actions.
                                super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              piVar6 = piVar6 + 1;
            } while (piVar6 != piVar1);
            piVar6 = (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar12 = (long)(pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar6;
            if (lVar12 == 0) goto LAB_0013b5fe;
            lVar12 = lVar12 >> 2;
            uVar8 = 0;
            iVar9 = 0;
            uVar11 = 0;
            do {
              iVar10 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[piVar6[uVar8]] -
                       local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8];
              if (0 < iVar10) {
                bVar2 = false;
              }
              if (iVar9 < iVar10) {
                uVar11 = uVar8 & 0xffffffff;
                iVar9 = iVar10;
              }
              uVar8 = uVar8 + 1;
            } while (lVar12 + (ulong)(lVar12 == 0) != uVar8);
            local_150 = (long)(int)uVar11;
          }
          if (!bVar2) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Agent ",6);
            poVar5 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)&std::cout,
                                (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start[local_150]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," wins!",6);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            piVar6 = (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          pPVar7 = local_e8.
                   super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_150;
          this_02 = (__return_storage_ptr__->
                    super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                    )._M_impl.super__Vector_impl_data._M_start + piVar6[local_150];
          std::
          vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
          ::operator=(&this_02->actions,&pPVar7->actions);
          this_02->cost = pPVar7->cost;
          local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[local_150]] =
               local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_150];
          operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
          std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
          ~vector(&local_e8);
          std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
          ~vector(&local_c8);
          pvVar13 = pvVar13 + 1;
        } while (pvVar13 != local_b0);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_88);
    } while ((!bVar2) && (iVar4 = iVar4 + 1, iVar4 < theta));
  }
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Plan> MultiAgentPlanner::solve_best_alternative_grouping(std::vector<PlanningAgent>& agents, 
																											const std::vector<Instance>& instances, 
																											const Scenario& scenario,
																											const int theta) {
	
	vector<Plan> plans = solve_baseline(agents, instances);

	vector<int> costs(agents.size());
	for (int id = 0; id < agents.size(); ++id) {
		costs[id] = evaluate_one_plan(plans, scenario, plans[id], id);
	}

	int iteration_counter = 1;
	bool convergence = false;

	while ((! convergence) && (iteration_counter < theta)) {
		cout << "!!!!!!!!!!!! Iteration " << iteration_counter << " !!!!!!!!!!!!" << endl;

		vector<vector<int> > groups = get_interacting_groups(plans, scenario);
		
		convergence = true;

		for (auto& group : groups) {
			
			vector<Plan> group_plans;
			for (int id : group) {
				group_plans.push_back(plans[id]);
			}

			vector<Plan> alternativePlans;
			vector<int> alternativeCosts;

			for (int id : group) {
				Plan plan = agents[id].computeInterDependentPlan(instances[id], scenario, group_plans);

				alternativePlans.push_back(plan);

				cout << agents[id].planToString(plan);

				alternativeCosts.push_back(plan.cost);
			}

			int best_alt = 0;
			int best_diff = 0;
			
			for (int i = 0; i < group.size(); ++i) {
				int cost_diff = costs[group[i]] - alternativeCosts[i];

				if (cost_diff > 0) {
					convergence = false;
				}
				
				if (cost_diff > best_diff) {
					best_diff = cost_diff;
					best_alt = i;
				}
			}

			if (! convergence) {
				cout << "Agent " << group[best_alt] << " wins!" << endl;
			}

			plans[group[best_alt]] = alternativePlans[best_alt];
			costs[group[best_alt]] = alternativeCosts[best_alt];

		}




		iteration_counter++;

	}

	return plans;
}